

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O1

bool __thiscall cmGetPropertyCommand::HandleVariableMode(cmGetPropertyCommand *this)

{
  size_type sVar1;
  char *value;
  string local_40;
  
  sVar1 = (this->Name)._M_string_length;
  if (sVar1 == 0) {
    value = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,&this->PropertyName);
    StoreResult(this,value);
  }
  else {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"given name for VARIABLE scope.","");
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return sVar1 == 0;
}

Assistant:

bool cmGetPropertyCommand::HandleVariableMode()
{
  if(!this->Name.empty())
    {
    this->SetError("given name for VARIABLE scope.");
    return false;
    }

  return this->StoreResult
    (this->Makefile->GetDefinition(this->PropertyName));
}